

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

void __thiscall compiler::CompilerAstWalker::popEmissionContext(CompilerAstWalker *this)

{
  bool mustBeTrue;
  element_type *peVar1;
  allocator<char> local_41;
  string local_40;
  undefined1 local_20 [8];
  shared_ptr<compiler::EmissionContext> outer;
  CompilerAstWalker *this_local;
  
  outer.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  peVar1 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  std::shared_ptr<compiler::EmissionContext>::shared_ptr
            ((shared_ptr<compiler::EmissionContext> *)local_20,&peVar1->outerContext);
  mustBeTrue = std::operator!=((shared_ptr<compiler::EmissionContext> *)local_20,(nullptr_t)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"popEmissionContext called when outer context is none!",&local_41);
  Error::assertWithPanic(mustBeTrue,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::shared_ptr<compiler::EmissionContext>::operator=
            (&this->ec,(shared_ptr<compiler::EmissionContext> *)local_20);
  std::shared_ptr<compiler::EmissionContext>::~shared_ptr
            ((shared_ptr<compiler::EmissionContext> *)local_20);
  return;
}

Assistant:

void popEmissionContext() noexcept {
    auto outer = this->ec->outerContext;
    Error::assertWithPanic(outer != nullptr, "popEmissionContext called when outer context is none!");
    this->ec = outer;
  }